

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O3

void __thiscall
Assimp::Blender::TempArray<std::vector,_Assimp::Blender::BlenderModifier>::~TempArray
          (TempArray<std::vector,_Assimp::Blender::BlenderModifier> *this)

{
  pointer ppBVar1;
  pointer ppBVar2;
  mywrap *__range3;
  
  ppBVar2 = (this->arr).
            super__Vector_base<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->arr).
            super__Vector_base<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar2 != ppBVar1) {
    do {
      if (*ppBVar2 != (BlenderModifier *)0x0) {
        (*(*ppBVar2)->_vptr_BlenderModifier[1])();
      }
      ppBVar2 = ppBVar2 + 1;
    } while (ppBVar2 != ppBVar1);
    ppBVar2 = (this->arr).
              super__Vector_base<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppBVar2 != (pointer)0x0) {
    operator_delete(ppBVar2,(long)(this->arr).
                                  super__Vector_base<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar2
                   );
    return;
  }
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }